

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_busyindicator.cpp
# Opt level: O0

void QtMWidgets::BusyIndicator::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  QColor *pQVar4;
  void *_v_1;
  BusyIndicator *_t_2;
  void *_v;
  BusyIndicator *_t_1;
  BusyIndicator *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      _q_update((BusyIndicator *)_o,(QVariant *)_a[1]);
    }
  }
  else if (_c == ReadProperty) {
    piVar1 = (int *)*_a;
    if (_id == 0) {
      bVar2 = isRunning((BusyIndicator *)_o);
      *(bool *)piVar1 = bVar2;
    }
    else if (_id == 1) {
      pQVar4 = color((BusyIndicator *)_o);
      *(undefined8 *)piVar1 = *(undefined8 *)pQVar4;
      piVar1[2] = *(int *)((long)&pQVar4->ct + 4);
      *(ushort *)(piVar1 + 3) = (pQVar4->ct).argb.pad;
    }
    else if (_id == 2) {
      iVar3 = radius((BusyIndicator *)_o);
      *piVar1 = iVar3;
    }
  }
  else if (_c == WriteProperty) {
    pQVar4 = (QColor *)*_a;
    if (_id == 0) {
      setRunning((BusyIndicator *)_o,(bool)((char)pQVar4->cspec & Rgb));
    }
    else if (_id == 1) {
      setColor((BusyIndicator *)_o,pQVar4);
    }
    else if (_id == 2) {
      setRadius((BusyIndicator *)_o,pQVar4->cspec);
    }
  }
  return;
}

Assistant:

void QtMWidgets::BusyIndicator::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_update((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->isRunning(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->radius(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRunning(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setRadius(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}